

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-bookmarks.cc
# Opt level: O1

void generate_page_map(QPDF *qpdf)

{
  mapped_type *pmVar1;
  int iVar2;
  QPDFPageObjectHelper *page;
  long lVar3;
  QPDFPageDocumentHelper dh;
  QPDFObjGen local_68;
  long local_60;
  long local_58;
  QPDFPageDocumentHelper local_48;
  
  QPDFPageDocumentHelper::QPDFPageDocumentHelper(&local_48,qpdf);
  QPDFPageDocumentHelper::getAllPages();
  if (local_60 != local_58) {
    iVar2 = 1;
    lVar3 = local_60;
    do {
      local_68 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)(lVar3 + 8));
      pmVar1 = std::
               map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
               ::operator[](&page_map,&local_68);
      *pmVar1 = iVar2;
      lVar3 = lVar3 + 0x38;
      iVar2 = iVar2 + 1;
    } while (lVar3 != local_58);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_60);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_48);
  return;
}

Assistant:

void
generate_page_map(QPDF& qpdf)
{
    QPDFPageDocumentHelper dh(qpdf);
    int n = 0;
    for (auto const& page: dh.getAllPages()) {
        page_map[page] = ++n;
    }
}